

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-solver-c.cc
# Opt level: O0

NLW2_NLSolution_C * NLW2_WrapNLSOL_Solution_C(NLW2_NLSolver_C *nlse,NLSolution *sol)

{
  bool bVar1;
  size_type sVar2;
  char *pcVar3;
  NLW2_NLSuffix_C *pNVar4;
  reference pNVar5;
  size_type sVar6;
  double *pdVar7;
  long in_RSI;
  NLW2_NLSolution_C *in_RDI;
  NLW2_NLSuffix_C suf_c;
  NLSuffix *suf;
  iterator __end2;
  iterator __begin2;
  NLSuffixSet *__range2;
  NLSolution *sol_1;
  NLW2_Solution_C_Data *sol_data;
  NLSolution *in_stack_ffffffffffffff78;
  value_type *__x;
  NLW2_Solution_C_Data *in_stack_ffffffffffffff80;
  size_type in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  _Self local_38;
  _Self local_30;
  NLSuffixSet *local_28;
  NLW2_Solution_C_Data *local_20;
  NLW2_Solution_C_Data *local_18;
  long local_8;
  
  local_8 = in_RSI;
  if (*(long *)(in_RSI + 0x10) == 0) {
    in_stack_ffffffffffffff80 = (NLW2_Solution_C_Data *)operator_new(0xa8);
    mp::NLW2_Solution_C_Data::NLW2_Solution_C_Data(in_stack_ffffffffffffff80);
    *(NLW2_Solution_C_Data **)(local_8 + 0x10) = in_stack_ffffffffffffff80;
  }
  local_18 = anon_unknown.dwarf_21f24::CastNZ<mp::NLW2_Solution_C_Data>(*(void **)(local_8 + 0x10));
  mp::NLSolution::operator=(&in_stack_ffffffffffffff80->sol_,in_stack_ffffffffffffff78);
  local_20 = local_18;
  in_RDI->nbs_ = (local_18->sol_).nbs_;
  sVar2 = std::set<mp::NLSuffix,_std::less<mp::NLSuffix>,_std::allocator<mp::NLSuffix>_>::size
                    ((set<mp::NLSuffix,_std::less<mp::NLSuffix>,_std::allocator<mp::NLSuffix>_> *)
                     0x10a397);
  in_RDI->nsuf_ = (int)sVar2;
  in_RDI->obj_val_ = (local_20->sol_).obj_val_;
  pcVar3 = (char *)std::__cxx11::string::c_str();
  in_RDI->solve_message_ = pcVar3;
  in_RDI->solve_result_ = (local_20->sol_).solve_result_;
  std::vector<NLW2_NLSuffix_C,_std::allocator<NLW2_NLSuffix_C>_>::clear
            ((vector<NLW2_NLSuffix_C,_std::allocator<NLW2_NLSuffix_C>_> *)0x10a3e5);
  __x = (value_type *)&local_18->suffixes_;
  std::set<mp::NLSuffix,_std::less<mp::NLSuffix>,_std::allocator<mp::NLSuffix>_>::size
            ((set<mp::NLSuffix,_std::less<mp::NLSuffix>,_std::allocator<mp::NLSuffix>_> *)0x10a402);
  std::vector<NLW2_NLSuffix_C,_std::allocator<NLW2_NLSuffix_C>_>::reserve
            ((vector<NLW2_NLSuffix_C,_std::allocator<NLW2_NLSuffix_C>_> *)
             CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),in_stack_ffffffffffffffa8
            );
  pNVar4 = std::vector<NLW2_NLSuffix_C,_std::allocator<NLW2_NLSuffix_C>_>::data
                     ((vector<NLW2_NLSuffix_C,_std::allocator<NLW2_NLSuffix_C>_> *)0x10a41f);
  in_RDI->suffixes_ = pNVar4;
  local_28 = &(local_20->sol_).suffixes_;
  local_30._M_node =
       (_Base_ptr)
       std::set<mp::NLSuffix,_std::less<mp::NLSuffix>,_std::allocator<mp::NLSuffix>_>::begin
                 ((set<mp::NLSuffix,_std::less<mp::NLSuffix>,_std::allocator<mp::NLSuffix>_> *)__x);
  local_38._M_node =
       (_Base_ptr)
       std::set<mp::NLSuffix,_std::less<mp::NLSuffix>,_std::allocator<mp::NLSuffix>_>::end
                 ((set<mp::NLSuffix,_std::less<mp::NLSuffix>,_std::allocator<mp::NLSuffix>_> *)__x);
  while( true ) {
    bVar1 = std::operator!=(&local_30,&local_38);
    if (!bVar1) break;
    pNVar5 = std::_Rb_tree_const_iterator<mp::NLSuffix>::operator*
                       ((_Rb_tree_const_iterator<mp::NLSuffix> *)in_stack_ffffffffffffff80);
    std::__cxx11::string::c_str();
    std::__cxx11::string::c_str();
    std::vector<double,_std::allocator<double>_>::size(&pNVar5->values_);
    std::vector<double,_std::allocator<double>_>::data
              ((vector<double,_std::allocator<double>_> *)0x10a4cc);
    std::vector<NLW2_NLSuffix_C,_std::allocator<NLW2_NLSuffix_C>_>::push_back
              ((vector<NLW2_NLSuffix_C,_std::allocator<NLW2_NLSuffix_C>_> *)
               in_stack_ffffffffffffff80,__x);
    std::_Rb_tree_const_iterator<mp::NLSuffix>::operator++
              ((_Rb_tree_const_iterator<mp::NLSuffix> *)in_stack_ffffffffffffff80);
  }
  sVar6 = std::vector<double,_std::allocator<double>_>::size(&(local_20->sol_).x_);
  in_RDI->n_primal_values_ = (int)sVar6;
  pdVar7 = std::vector<double,_std::allocator<double>_>::data
                     ((vector<double,_std::allocator<double>_> *)0x10a51d);
  in_RDI->x_ = pdVar7;
  sVar6 = std::vector<double,_std::allocator<double>_>::size(&(local_20->sol_).y_);
  in_RDI->n_dual_values_ = (int)sVar6;
  pdVar7 = std::vector<double,_std::allocator<double>_>::data
                     ((vector<double,_std::allocator<double>_> *)0x10a550);
  in_RDI->y_ = pdVar7;
  return in_RDI;
}

Assistant:

static NLW2_NLSolution_C NLW2_WrapNLSOL_Solution_C
(NLW2_NLSolver_C* nlse, mp::NLSolution sol) {
  // Store the C++ data
  if (!nlse->p_sol_)
    nlse->p_sol_ = new mp::NLW2_Solution_C_Data;
  auto& sol_data = *CastNZ<mp::NLW2_Solution_C_Data>(nlse->p_sol_);
  sol_data.sol_ = std::move(sol);

  NLW2_NLSolution_C result;
  {
    const auto& sol=sol_data.sol_;
    result.nbs_ = sol.nbs_;
    result.nsuf_ = sol.suffixes_.size();
    result.obj_val_ = sol.obj_val_;
    result.solve_message_ = sol.solve_message_.c_str();
    result.solve_result_ = sol.solve_result_;
    sol_data.suffixes_.clear();
    sol_data.suffixes_.reserve(sol.suffixes_.size());
    result.suffixes_ = sol_data.suffixes_.data();
    for (const auto& suf: sol.suffixes_) {
      NLW2_NLSuffix_C suf_c;
      suf_c.kind_ = suf.kind_;
      suf_c.name_ = suf.name_.c_str();
      suf_c.table_ = suf.table_.c_str();
      suf_c.numval_ = suf.values_.size();
      suf_c.values_ = suf.values_.data();
      sol_data.suffixes_.push_back(std::move(suf_c));
    }
    result.n_primal_values_ = sol.x_.size();
    result.x_ = sol.x_.data();
    result.n_dual_values_ = sol.y_.size();
    result.y_ = sol.y_.data();
  }
  return result;
}